

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O2

void tcp_listener_doaccept(tcp_listener *l)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  nng_err nVar4;
  nni_aio *aio;
  int *piVar5;
  nni_tcp_conn *local_38;
  nni_tcp_conn *c;
  
LAB_00131926:
  while( true ) {
    aio = (nni_aio *)nni_list_first(&l->acceptq);
    if (aio == (nni_aio *)0x0) {
      return;
    }
    iVar3 = nni_posix_pfd_fd(&l->pfd);
    iVar3 = accept(iVar3,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar3 < 0) goto LAB_00131983;
    nVar4 = nni_posix_tcp_alloc(&local_38,(nni_tcp_dialer *)0x0,iVar3);
    if (nVar4 != NNG_OK) break;
    _Var1 = l->keepalive;
    _Var2 = l->nodelay;
    nni_aio_list_remove(aio);
    nni_posix_tcp_start(local_38,(uint)_Var2,(uint)_Var1);
    nni_aio_set_output(aio,0,local_38);
    nni_aio_finish(aio,NNG_OK,0);
  }
  close(iVar3);
  goto LAB_0013196f;
LAB_00131983:
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  if (1 < iVar3 - 0x67U) {
    if (iVar3 == 0xb) {
      nVar4 = nni_posix_pfd_arm(&l->pfd,1);
      if (nVar4 == NNG_OK) {
        return;
      }
LAB_0013196f:
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,nVar4);
    }
    else {
      nVar4 = nni_plat_errno(iVar3);
      if (nVar4 == NNG_OK) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_tcplisten.c"
                  ,0x7b,"rv != 0");
      }
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,nVar4);
    }
  }
  goto LAB_00131926;
}

Assistant:

static void
tcp_listener_doaccept(tcp_listener *l)
{
	nni_aio *aio;

	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		int           newfd;
		int           fd;
		int           rv;
		int           nd;
		int           ka;
		nni_tcp_conn *c;

		fd = nni_posix_pfd_fd(&l->pfd);

#ifdef NNG_USE_ACCEPT4
		newfd = accept4(fd, NULL, NULL, SOCK_CLOEXEC);
		if ((newfd < 0) && ((errno == ENOSYS) || (errno == ENOTSUP))) {
			newfd = accept(fd, NULL, NULL);
		}
#else
		newfd = accept(fd, NULL, NULL);
#endif
		if (newfd < 0) {
			switch (errno) {
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				rv = nni_posix_pfd_arm(&l->pfd, NNI_POLL_IN);
				if (rv != 0) {
					nni_aio_list_remove(aio);
					nni_aio_finish_error(aio, rv);
					continue;
				}
				// Come back later...
				return;
			case ECONNABORTED:
			case ECONNRESET:
				// Eat them, they aren't interesting.
				continue;
			default:
				// Error this one, but keep moving to the next.
				rv = nni_plat_errno(errno);
				NNI_ASSERT(rv != 0);
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, rv);
				continue;
			}
		}

		if ((rv = nni_posix_tcp_alloc(&c, NULL, newfd)) != 0) {
			close(newfd);
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		ka = l->keepalive ? 1 : 0;
		nd = l->nodelay ? 1 : 0;
		nni_aio_list_remove(aio);
		nni_posix_tcp_start(c, nd, ka);
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}